

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O2

char * map_enum(enum_map_t *map,uint32_t value)

{
  enum_map_t *peVar1;
  
  do {
    peVar1 = map;
    if (peVar1->value == 0xffffffff) {
      snprintf(map_enum::unknown,0x10,"unknown (%u)");
      map_enum::unknown[0xf] = '\0';
      return map_enum::unknown;
    }
    map = peVar1 + 1;
  } while (peVar1->value != value);
  return peVar1->name;
}

Assistant:

static const char *
map_enum(const enum_map_t *map, uint32_t value) {
    static char unknown[16];
    size_t i = 0;

    while (map[i].value < UINT32_MAX) {
        if (map[i].value == value) {
            return map[i].name;
        }
        i++;
    }

    snprintf(unknown, sizeof(unknown), "unknown (%u)", value);
    unknown[sizeof(unknown) - 1] = '\0';

    return unknown;
}